

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldsTable.cpp
# Opt level: O1

string * __thiscall
ser::FieldsTable::FieldFromJSON_abi_cxx11_
          (string *__return_storage_ptr__,FieldsTable *this,JSONNode *node)

{
  DataFieldInfo info;
  DataFieldInfo local_c8;
  
  DataFieldInfo::DataFieldInfo(&local_c8);
  DataFieldInfo::FromJSON(&local_c8,node);
  RegisterField(this,&local_c8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_c8.name_._M_dataplus._M_p,
             local_c8.name_._M_dataplus._M_p + local_c8.name_._M_string_length);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
               *)&local_c8.metainfo_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.type_._M_dataplus._M_p != &local_c8.type_.field_2) {
    operator_delete(local_c8.type_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.name_._M_dataplus._M_p != &local_c8.name_.field_2) {
    operator_delete(local_c8.name_._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldsTable::FieldFromJSON(const JSONNode& node)
{
    DataFieldInfo info;
    info.FromJSON(node);
    RegisterField(info);
    return info.name();
}